

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O3

void NextChunk(ListChunkTraverseInfo *info,size_t nb,int reverse)

{
  size_t *psVar1;
  Col_Word list;
  size_t sVar2;
  long lVar3;
  anon_struct_24_3_2a41905f *paVar4;
  
  psVar1 = &info->max;
  *psVar1 = *psVar1 - nb;
  if (*psVar1 == 0) {
    lVar3 = (long)info->prevDepth;
    if (lVar3 == 0x7fffffff) {
      info->list = 0;
    }
    else {
      paVar4 = info->backtracks;
      list = paVar4[lVar3 + -1].list;
      info->list = list;
      info->max = paVar4[lVar3 + -1].max;
      if (reverse == 0) {
        sVar2 = 0;
      }
      else {
        sVar2 = Col_ListLength(list);
        sVar2 = sVar2 - 1;
        paVar4 = info->backtracks;
        lVar3 = (long)info->prevDepth;
      }
      info->start = sVar2;
      info->prevDepth = paVar4[lVar3 + -1].prevDepth;
    }
  }
  else {
    if (reverse == 0) {
      sVar2 = info->start + nb;
    }
    else {
      sVar2 = info->start - nb;
    }
    info->start = sVar2;
  }
  return;
}

Assistant:

static void
NextChunk(
    RopeChunkTraverseInfo *info,    /*!< Traversal info. */
    size_t nb,                      /*!< Number of characters to skip. */
    int reverse)                    /*!< Whether to traverse in reverse order.*/
{
    ASSERT(info->max >= nb);
    info->max -= nb;
    if (info->max > 0) {
        /*
         * Still in leaf, advance.
         */

        if (reverse) {
            info->start -= nb;
        } else {
            info->start += nb;
        }
    } else if (info->prevDepth == INT_MAX) {
        /*
         * Already at toplevel => end of rope.
         */

        info->rope = WORD_NIL;
    } else {
        /*
         * Reached leaf bound, backtracks.
         */

        ASSERT(info->backtracks);
        info->rope = info->backtracks[info->prevDepth-1].rope;
        info->max = info->backtracks[info->prevDepth-1].max;
        info->start = (reverse ? Col_RopeLength(info->rope)-1 : 0);
        info->prevDepth = info->backtracks[info->prevDepth-1].prevDepth;
    }
}